

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult gt_timer_access(CPUARMState_conflict *env,int timeridx,_Bool isread)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar3 = 0;
      }
      else if (uVar3 == 0x16) {
LAB_0061cc90:
        uVar3 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar3 = 2;
      }
      else {
        if ((uVar1 & 0x200000000) != 0) {
          if (uVar3 == 0x16) {
            uVar3 = 3;
            if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061cc96;
          }
          else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061cc90;
        }
        uVar3 = 1;
      }
    }
    else {
      uVar3 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar3 = 1;
    if ((env->v7m).exception == 0) {
      uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061cc96:
  if ((uVar1 & 0x200000000) == 0) {
    bVar4 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar4 = true;
      if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_0061ccc3;
    }
    else {
      bVar4 = true;
      if ((~env->pstate & 0xc) == 0) goto LAB_0061ccc3;
    }
    bVar4 = ((env->cp15).scr_el3 & 1) == 0;
  }
LAB_0061ccc3:
  uVar2 = arm_hcr_el2_eff_aarch64(env);
  if (uVar3 != 1) {
    if (uVar3 != 0) {
      return CP_ACCESS_OK;
    }
    if ((~uVar2 & 0x408000000) == 0) {
      return (uint)(((env->cp15).cnthctl_el2 >> ((byte)(9 - (char)timeridx) & 0x1f) & 1) == 0) * 3;
    }
    if (((uint)(env->cp15).c14_cntkctl >> ((byte)(9 - (char)timeridx) & 0x1f) & 1) == 0) {
      return CP_ACCESS_TRAP;
    }
  }
  if (!(bool)(timeridx != 0 | bVar4 | (uVar1 >> 0x20 & 1) == 0)) {
    uVar3 = (env->cp15).cnthctl_el2;
    if ((uVar2 & 0x400000000) == 0) {
      uVar3 = uVar3 & 2;
    }
    else {
      uVar3 = uVar3 >> 0xb & 1;
    }
    if (uVar3 == 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult gt_timer_access(CPUARMState *env, int timeridx,
                                      bool isread)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    uint64_t hcr = arm_hcr_el2_eff(env);

    switch (cur_el) {
    case 0:
        if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
            /* If HCR_EL2.<E2H,TGE> == '11': check CNTHCTL_EL2.EL0[PV]TEN. */
            return (extract32(env->cp15.cnthctl_el2, 9 - timeridx, 1)
                    ? CP_ACCESS_OK : CP_ACCESS_TRAP_EL2);
        }

        /*
         * CNT[PV]_CVAL, CNT[PV]_CTL, CNT[PV]_TVAL: not visible from
         * EL0 if EL0[PV]TEN is zero.
         */
        if (!extract32(env->cp15.c14_cntkctl, 9 - timeridx, 1)) {
            return CP_ACCESS_TRAP;
        }
        /* fall through */

    case 1:
        if (arm_feature(env, ARM_FEATURE_EL2) &&
            timeridx == GTIMER_PHYS && !secure) {
            if (hcr & HCR_E2H) {
                /* If HCR_EL2.<E2H,TGE> == '10': check CNTHCTL_EL2.EL1PTEN. */
                if (!extract32(env->cp15.cnthctl_el2, 11, 1)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                /* If HCR_EL2.<E2H> == 0: check CNTHCTL_EL2.EL1PCEN. */
                if (!extract32(env->cp15.cnthctl_el2, 1, 1)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        }
        break;
    }
    return CP_ACCESS_OK;
}